

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTableSize(SharedValidator *this,Location *loc,Var *table_var)

{
  Result rhs;
  Var local_78;
  Enum local_30;
  Opcode local_2c;
  Var *local_28;
  Var *table_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_28 = table_var;
  table_var_local = (Var *)loc;
  loc_local = (Location *)this;
  Opcode::Opcode(&local_2c,TableSize);
  this_local._4_4_ = CheckInstr(this,local_2c,&table_var_local->loc);
  Var::Var(&local_78,table_var);
  local_30 = (Enum)CheckTableIndex(this,&local_78,(TableType *)0x0);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
  Var::~Var(&local_78);
  rhs = TypeChecker::OnTableSize(&this->typechecker_);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTableSize(const Location& loc, Var table_var) {
  Result result = CheckInstr(Opcode::TableSize, loc);
  result |= CheckTableIndex(table_var);
  result |= typechecker_.OnTableSize();
  return result;
}